

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_hmac.c
# Opt level: O3

int csp_hmac_set_key(void *key,uint32_t keylen)

{
  uint8_t hash [20];
  uint8_t local_28 [8];
  uint8_t auStack_20 [24];
  
  csp_sha1_memory(key,keylen,local_28);
  csp_hmac_key[0] = local_28[0];
  csp_hmac_key[1] = local_28[1];
  csp_hmac_key[2] = local_28[2];
  csp_hmac_key[3] = local_28[3];
  csp_hmac_key[4] = local_28[4];
  csp_hmac_key[5] = local_28[5];
  csp_hmac_key[6] = local_28[6];
  csp_hmac_key[7] = local_28[7];
  csp_hmac_key[8] = auStack_20[0];
  csp_hmac_key[9] = auStack_20[1];
  csp_hmac_key[10] = auStack_20[2];
  csp_hmac_key[0xb] = auStack_20[3];
  csp_hmac_key[0xc] = auStack_20[4];
  csp_hmac_key[0xd] = auStack_20[5];
  csp_hmac_key[0xe] = auStack_20[6];
  csp_hmac_key[0xf] = auStack_20[7];
  return 0;
}

Assistant:

int csp_hmac_set_key(const void * key, uint32_t keylen) {

	/* Use SHA1 as KDF */
	uint8_t hash[CSP_SHA1_DIGESTSIZE];
	csp_sha1_memory(key, keylen, hash);

	/* Copy key */
	memcpy(csp_hmac_key, hash, sizeof(csp_hmac_key));

	return CSP_ERR_NONE;
}